

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O0

double inform_shannon_multi_mi(inform_dist *joint,inform_dist **marginals,size_t n,double base)

{
  double dVar1;
  ulong local_40;
  size_t i;
  double pmi;
  double base_local;
  size_t n_local;
  inform_dist **marginals_local;
  inform_dist *joint_local;
  
  if (n < 2) {
    joint_local = (inform_dist *)0x0;
  }
  else {
    dVar1 = inform_shannon_entropy(joint,base);
    i = (size_t)-dVar1;
    for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
      dVar1 = inform_shannon_entropy(marginals[local_40],base);
      i = (size_t)(dVar1 + (double)i);
    }
    joint_local = (inform_dist *)i;
  }
  return (double)joint_local;
}

Assistant:

double inform_shannon_multi_mi(inform_dist const *joint,
    inform_dist const **marginals, size_t n, double base)
{
    if (n < 2)
    {
        return 0.0;
    }
    double pmi = -inform_shannon_entropy(joint, base);
    for (size_t i = 0; i < n; ++i)
    {
        pmi += inform_shannon_entropy(marginals[i], base);
    }
    return pmi;
}